

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void crnlib::end_zero_run(uint *size,vector<unsigned_short> *codes)

{
  int iVar1;
  ushort local_1e;
  ushort local_1c;
  unsigned_short local_1a;
  vector<unsigned_short> *local_18;
  vector<unsigned_short> *codes_local;
  uint *size_local;
  
  if (*size != 0) {
    local_18 = codes;
    codes_local = (vector<unsigned_short> *)size;
    if (*size < 3) {
      while (iVar1 = *(int *)&codes_local->m_p, *(int *)&codes_local->m_p = iVar1 + -1, iVar1 != 0)
      {
        local_1a = 0;
        vector<unsigned_short>::push_back(local_18,&local_1a);
      }
    }
    else if (*size < 0xb) {
      local_1c = ((short)*size + -3) * 0x100 | 0x11;
      vector<unsigned_short>::push_back(codes,&local_1c);
    }
    else {
      local_1e = ((short)*size + -0xb) * 0x100 | 0x12;
      vector<unsigned_short>::push_back(codes,&local_1e);
    }
    *(undefined4 *)&codes_local->m_p = 0;
  }
  return;
}

Assistant:

static inline void end_zero_run(uint& size, crnlib::vector<uint16>& codes)
    {
        if (!size)
        {
            return;
        }

        if (size < cMinSmallZeroRunSize)
        {
            while (size--)
            {
                codes.push_back(0);
            }
        }
        else if (size <= cMaxSmallZeroRunSize)
        {
            codes.push_back(static_cast<uint16>(cSmallZeroRunCode | ((size - cMinSmallZeroRunSize) << 8)));
        }
        else
        {
            CRNLIB_ASSERT((size >= cMinLargeZeroRunSize) && (size <= cMaxLargeZeroRunSize));
            codes.push_back(static_cast<uint16>(cLargeZeroRunCode | ((size - cMinLargeZeroRunSize) << 8)));
        }

        size = 0;
    }